

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sync.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2f1133::SyncFixture::add
          (SyncFixture *this,transaction_type *transaction,string *key,string *value)

{
  shared_ptr<char> ptr;
  typed_address<char> where;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  index;
  typed_address<char> *local_138;
  undefined1 *local_130;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_128;
  
  where.a_.a_ = (address)0;
  ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pstore::transaction_base::alloc_rw<char,void>
            ((pair<std::shared_ptr<char>,_pstore::typed_address<char>_> *)&index,
             &transaction->super_transaction_base,value->_M_string_length);
  local_138 = &where;
  local_130 = (undefined1 *)&ptr;
  std::tuple<std::shared_ptr<char>&,pstore::typed_address<char>&>::operator=
            ((tuple<std::shared_ptr<char>&,pstore::typed_address<char>&> *)&local_138,
             (pair<std::shared_ptr<char>,_pstore::typed_address<char>_> *)&index);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&index.
              super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  if (value->_M_string_length != 0) {
    memmove(ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
            (value->_M_dataplus)._M_p,value->_M_string_length);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pstore::index::
  get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
            ((index *)&index,&this->db_,true);
  ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value->_M_string_length;
  ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)where.a_.a_;
  pstore::index::
  hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  ::insert_or_assign<std::__cxx11::string,pstore::extent<char>,void>
            (&local_128,
             (hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
              *)index.
                super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,&transaction->super_transaction_base,key,(extent<char> *)&ptr);
  std::
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
  ::~unique_ptr(&local_128.first.pos_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&index.
              super___shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void SyncFixture::add (transaction_type & transaction, std::string const & key,
                           std::string const & value) {

        auto where = pstore::typed_address<char>::null ();
        {
            // Allocate storage for string 'value' and copy the data into it.
            std::shared_ptr<char> ptr;
            std::tie (ptr, where) = transaction.alloc_rw<char> (value.length ());
            std::copy (std::begin (value), std::end (value), ptr.get ());
        }

        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        index->insert_or_assign (transaction, key, make_extent (where, value.length ()));
    }